

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O2

dev_t pack_netbsd(int n,u_long *numbers,char **error)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  
  if (n == 2) {
    uVar1 = numbers[1];
    uVar4 = (uint)*numbers;
    uVar2 = (uVar1 & 0xff) + (ulong)((uVar4 & 0xfff) << 8) | (ulong)(((uint)uVar1 & 0xfff00) << 0xc)
    ;
    if ((ulong)(uVar4 & 0xfff) == *numbers) {
      if (((ulong)((uint)uVar1 & 0xfff00) | uVar1 & 0xff) == uVar1) {
        return uVar2;
      }
      pcVar3 = "invalid minor number";
    }
    else {
      pcVar3 = "invalid major number";
    }
  }
  else {
    pcVar3 = "too many fields for format";
    uVar2 = 0;
  }
  *error = pcVar3;
  return uVar2;
}

Assistant:

static dev_t
pack_netbsd(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_netbsd(numbers[0], numbers[1]);
		if ((u_long)major_netbsd(dev) != numbers[0])
			*error = iMajorError;
		else if ((u_long)minor_netbsd(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}